

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O3

ObjectReference __thiscall
PDFHummus::DocumentContext::GetReferenceFromState(DocumentContext *this,PDFDictionary *inDictionary)

{
  PDFObject *pPVar1;
  PDFInteger *this_00;
  unsigned_long uVar2;
  ObjectReference OVar3;
  PDFObjectCastPtr<PDFInteger> objectID;
  PDFObjectCastPtr<PDFInteger> generationNumber;
  RefCountPtr<PDFInteger> local_78;
  RefCountPtr<PDFInteger> local_68;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ObjectID","");
  pPVar1 = PDFDictionary::QueryDirectObject(inDictionary,&local_38);
  local_78.mValue = PDFObjectCast<PDFInteger>(pPVar1);
  local_78._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GenerationNumber","");
  pPVar1 = PDFDictionary::QueryDirectObject(inDictionary,&local_58);
  this_00 = PDFObjectCast<PDFInteger>(pPVar1);
  local_68._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
  local_68.mValue = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  OVar3.ObjectID = PDFInteger::GetValue(local_78.mValue);
  uVar2 = PDFInteger::GetValue(this_00);
  RefCountPtr<PDFInteger>::~RefCountPtr(&local_68);
  RefCountPtr<PDFInteger>::~RefCountPtr(&local_78);
  OVar3.GenerationNumber = uVar2;
  return OVar3;
}

Assistant:

ObjectReference DocumentContext::GetReferenceFromState(PDFDictionary* inDictionary)
{
    PDFObjectCastPtr<PDFInteger> objectID(inDictionary->QueryDirectObject("ObjectID"));
    PDFObjectCastPtr<PDFInteger> generationNumber(inDictionary->QueryDirectObject("GenerationNumber"));

    return ObjectReference((ObjectIDType)(objectID->GetValue()),(unsigned long)generationNumber->GetValue());
}